

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

void * __thiscall
xercesc_4_0::DOMDocumentImpl::setUserData
          (DOMDocumentImpl *this,DOMNodeImpl *n,XMLCh *key,void *data,DOMUserDataHandler *handler)

{
  uint key2;
  KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *pKVar1;
  RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  *pRVar2;
  void *pvVar3;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  enumKeys;
  
  key2 = XMLStringPool::addOrFind(&this->fUserDataTableKeys,key);
  if (this->fUserDataTable ==
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    pRVar2 = (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
              *)XMemory::operator_new(0x30,this->fMemoryManager);
    RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::RefHash2KeysTableOf(pRVar2,0x6d,true,this->fMemoryManager);
    this->fUserDataTable = pRVar2;
  }
  else {
    pKVar1 = RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
             ::get(this->fUserDataTable,n,key2);
    if (pKVar1 != (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)0x0) {
      pvVar3 = pKVar1->fKey;
      RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
      ::removeKey(this->fUserDataTable,n,key2);
      goto LAB_002770d0;
    }
  }
  pvVar3 = (void *)0x0;
LAB_002770d0:
  if (data == (void *)0x0) {
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::RefHash2KeysTableOfEnumerator(&enumKeys,this->fUserDataTable,false,this->fMemoryManager);
    enumKeys.fLockPrimaryKey = n;
    (*enumKeys.super_XMLEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>.
      _vptr_XMLEnumerator[4])(&enumKeys);
    if ((enumKeys.fCurElem ==
         (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
          *)0x0) && (enumKeys.fCurHash == (enumKeys.fToEnum)->fHashModulus)) {
      n->flags = n->flags & 0xfdff;
    }
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::~RefHash2KeysTableOfEnumerator(&enumKeys);
  }
  else {
    pRVar2 = this->fUserDataTable;
    pKVar1 = (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)
             XMemory::operator_new(0x10,this->fMemoryManager);
    pKVar1->fKey = data;
    pKVar1->fValue = handler;
    RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::put(pRVar2,n,key2,pKVar1);
  }
  return pvVar3;
}

Assistant:

void* DOMDocumentImpl::setUserData(DOMNodeImpl* n, const XMLCh* key, void* data, DOMUserDataHandler* handler)
{
    void* oldData = 0;
    unsigned int keyId=fUserDataTableKeys.addOrFind(key);

    if (!fUserDataTable) {
        // create the table on heap so that it can be cleaned in destructor
        fUserDataTable = new (fMemoryManager) RefHash2KeysTableOf<DOMUserDataRecord, PtrHasher>
        (
            109
            , true
            , fMemoryManager
        );
    }
    else {
        DOMUserDataRecord* oldDataRecord = fUserDataTable->get((void*)n, keyId);

        if (oldDataRecord) {
            oldData = oldDataRecord->getKey();
            fUserDataTable->removeKey((void*)n, keyId);
        }
    }

    if (data) {

        // clone the key first, and create the DOMUserDataRecord
        // create on the heap and adopted by the hashtable which will delete it upon removal.
        fUserDataTable->put((void*)n, keyId, new (fMemoryManager) DOMUserDataRecord(data, handler));
    }
    else {
        RefHash2KeysTableOfEnumerator<DOMUserDataRecord, PtrHasher> enumKeys(fUserDataTable, false, fMemoryManager);
        enumKeys.setPrimaryKey(n);
        if (!enumKeys.hasMoreElements())
            n->hasUserData(false);
    }

    return oldData;
}